

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConfigDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ConfigRuleSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,
          SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *args_4,Token *args_5,
          SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *args_6,Token *args_7,
          SyntaxList<slang::syntax::ConfigRuleSyntax> *args_8,Token *args_9,
          NamedBlockClauseSyntax **args_10)

{
  Token name;
  Token config;
  Token design;
  Token semi2;
  Token endconfig;
  ConfigDeclarationSyntax *pCVar1;
  Info *in_RCX;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *in_RDX;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *unaff_RBX;
  undefined8 in_RSI;
  Info *in_RDI;
  undefined8 *in_R8;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *in_R9;
  undefined8 unaff_R12;
  Info *unaff_R13;
  NamedBlockClauseSyntax *unaff_R14;
  undefined8 *in_stack_00000008;
  long in_stack_00000018;
  size_t in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  BumpAllocator *in_stack_fffffffffffffef8;
  
  pCVar1 = (ConfigDeclarationSyntax *)
           allocate(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  config.info = (Info *)in_RCX->rawTextPtr;
  config._0_8_ = in_R8[1];
  name.info = (Info *)*in_R8;
  name._0_8_ = in_stack_00000008[1];
  design.info = in_RCX;
  design._0_8_ = in_R8;
  semi2.info = in_RDI;
  semi2.kind = (short)in_RSI;
  semi2._2_1_ = (char)((ulong)in_RSI >> 0x10);
  semi2.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  semi2.rawLen = (int)((ulong)in_RSI >> 0x20);
  endconfig.info = unaff_R13;
  endconfig.kind = (short)unaff_R12;
  endconfig._2_1_ = (char)((ulong)unaff_R12 >> 0x10);
  endconfig.numFlags.raw = (char)((ulong)unaff_R12 >> 0x18);
  endconfig.rawLen = (int)((ulong)unaff_R12 >> 0x20);
  slang::syntax::ConfigDeclarationSyntax::ConfigDeclarationSyntax
            ((ConfigDeclarationSyntax *)*in_stack_00000008,
             *(SyntaxList<slang::syntax::AttributeInstanceSyntax> **)(in_stack_00000018 + 8),config,
             name,*(Token *)&in_RDX->super_SyntaxListBase,in_R9,design,in_RDX,semi2,unaff_RBX,
             endconfig,unaff_R14);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }